

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O1

void __thiscall KDReports::Test::fontScalerShouldScaleForHeight(Test *this)

{
  double dVar1;
  char cVar2;
  longlong __tmp;
  char16_t *pcVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QFont f;
  FontScaler scaler;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_b8;
  double local_a0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  undefined1 local_58 [16];
  qsizetype local_48;
  QFontMetricsF local_40 [8];
  double local_38;
  QByteArrayView local_30;
  char *local_20;
  
  if (fontFound) {
    local_98.d = (Data *)0x10c58a;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)&local_b8,(char **)&local_98);
    QVar4.m_data = (storage_type *)local_b8.d;
    QVar4.m_size = (qsizetype)local_58;
    QString::fromUtf8(QVar4);
    local_d8.d = (Data *)local_58._0_8_;
    local_d8.ptr = (char16_t *)local_58._8_8_;
    local_58._0_8_ = (Data *)0x0;
    local_58._8_8_ = (char16_t *)0x0;
    local_d8.size = local_48;
    local_48 = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    QFont::QFont((QFont *)&local_78,(QString *)&local_d8,-1,-1,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    QFont::setPixelSize((int)&local_78);
    KDReports::FontScaler::FontScaler((FontScaler *)local_58,(QFont *)&local_78);
    KDReports::FontScaler::setFactorForHeight(50.0);
    local_a0 = local_38;
    if (local_38 <= 0.42) {
      QString::number(local_38,(char)&local_b8,0x67);
      QString::toLocal8Bit_helper((QChar *)&local_d8,(longlong)local_b8.ptr);
      pcVar3 = local_d8.ptr;
      if (local_d8.ptr == (char16_t *)0x0) {
        pcVar3 = (char16_t *)&QByteArray::_empty;
      }
      cVar2 = QTest::qVerify(false,"factor > 0.42",(char *)pcVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x77);
    }
    else {
      QString::number(local_38,(char)&local_b8,0x67);
      QString::toLocal8Bit_helper((QChar *)&local_d8,(longlong)local_b8.ptr);
      pcVar3 = local_d8.ptr;
      if (local_d8.ptr == (char16_t *)0x0) {
        pcVar3 = (char16_t *)&QByteArray::_empty;
      }
      cVar2 = QTest::qVerify(true,"factor > 0.42",(char *)pcVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x77);
    }
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    if (cVar2 != '\0') {
      if (0.49 <= local_a0) {
        QString::number(local_a0,(char)&local_b8,0x67);
        QString::toLocal8Bit_helper((QChar *)&local_d8,(longlong)local_b8.ptr);
        pcVar3 = local_d8.ptr;
        if (local_d8.ptr == (char16_t *)0x0) {
          pcVar3 = (char16_t *)&QByteArray::_empty;
        }
        cVar2 = QTest::qVerify(false,"factor < 0.49",(char *)pcVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x78);
      }
      else {
        QString::number(local_a0,(char)&local_b8,0x67);
        QString::toLocal8Bit_helper((QChar *)&local_d8,(longlong)local_b8.ptr);
        pcVar3 = local_d8.ptr;
        if (local_d8.ptr == (char16_t *)0x0) {
          pcVar3 = (char16_t *)&QByteArray::_empty;
        }
        cVar2 = QTest::qVerify(true,"factor < 0.49",(char *)pcVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x78);
      }
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      if (cVar2 != '\0') {
        QFontMetricsF::QFontMetricsF((QFontMetricsF *)&local_d8,(QFontMetricsF *)&local_48);
        local_a0 = (double)QFontMetricsF::height();
        QFontMetricsF::~QFontMetricsF((QFontMetricsF *)&local_d8);
        if (local_a0 <= 50.0) {
          QString::number(local_a0,(char)&local_b8,0x67);
          QString::toLocal8Bit_helper((QChar *)&local_d8,(longlong)local_b8.ptr);
          pcVar3 = local_d8.ptr;
          if (local_d8.ptr == (char16_t *)0x0) {
            pcVar3 = (char16_t *)&QByteArray::_empty;
          }
          cVar2 = QTest::qVerify(true,"scaledHeight <= wantedHeight",(char *)pcVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                 ,0x7c);
        }
        else {
          QString::number(local_a0,(char)&local_b8,0x67);
          QString::toLocal8Bit_helper((QChar *)&local_d8,(longlong)local_b8.ptr);
          pcVar3 = local_d8.ptr;
          if (local_d8.ptr == (char16_t *)0x0) {
            pcVar3 = (char16_t *)&QByteArray::_empty;
          }
          cVar2 = QTest::qVerify(false,"scaledHeight <= wantedHeight",(char *)pcVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                 ,0x7c);
        }
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        if (cVar2 != '\0') {
          if (local_a0 <= 44.0) {
            QString::number(local_a0,(char)&local_b8,0x67);
            QString::toLocal8Bit_helper((QChar *)&local_d8,(longlong)local_b8.ptr);
            pcVar3 = local_d8.ptr;
            if (local_d8.ptr == (char16_t *)0x0) {
              pcVar3 = (char16_t *)&QByteArray::_empty;
            }
            cVar2 = QTest::qVerify(false,"scaledHeight > wantedHeight - 6",(char *)pcVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                   ,0x7d);
          }
          else {
            QString::number(local_a0,(char)&local_b8,0x67);
            QString::toLocal8Bit_helper((QChar *)&local_d8,(longlong)local_b8.ptr);
            pcVar3 = local_d8.ptr;
            if (local_d8.ptr == (char16_t *)0x0) {
              pcVar3 = (char16_t *)&QByteArray::_empty;
            }
            cVar2 = QTest::qVerify(true,"scaledHeight > wantedHeight - 6",(char *)pcVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                   ,0x7d);
          }
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          if (cVar2 != '\0') {
            KDReports::FontScaler::setFactorForHeight(2.9);
            QFontMetricsF::QFontMetricsF((QFontMetricsF *)&local_d8,(QFontMetricsF *)&local_48);
            local_a0 = (double)QFontMetricsF::height();
            QFontMetricsF::~QFontMetricsF((QFontMetricsF *)&local_d8);
            if (local_a0 <= 4.0) {
              QFontMetricsF::QFontMetricsF((QFontMetricsF *)&local_98,(QFontMetricsF *)&local_48);
              dVar1 = (double)QFontMetricsF::height();
              QString::number(dVar1,(char)&local_b8,0x67);
              QString::toLocal8Bit_helper((QChar *)&local_d8,(longlong)local_b8.ptr);
              pcVar3 = local_d8.ptr;
              if (local_d8.ptr == (char16_t *)0x0) {
                pcVar3 = (char16_t *)&QByteArray::_empty;
              }
              QTest::qVerify(true,"scaler.fontMetrics().height() <= 4",(char *)pcVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x86);
            }
            else {
              QFontMetricsF::QFontMetricsF((QFontMetricsF *)&local_98,(QFontMetricsF *)&local_48);
              dVar1 = (double)QFontMetricsF::height();
              QString::number(dVar1,(char)&local_b8,0x67);
              QString::toLocal8Bit_helper((QChar *)&local_d8,(longlong)local_b8.ptr);
              pcVar3 = local_d8.ptr;
              if (local_d8.ptr == (char16_t *)0x0) {
                pcVar3 = (char16_t *)&QByteArray::_empty;
              }
              QTest::qVerify(false,"scaler.fontMetrics().height() <= 4",(char *)pcVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x86);
            }
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
            QFontMetricsF::~QFontMetricsF((QFontMetricsF *)&local_98);
          }
        }
      }
    }
    QFontMetricsF::~QFontMetricsF(local_40);
    QFontMetricsF::~QFontMetricsF((QFontMetricsF *)&local_48);
    QFont::~QFont((QFont *)local_58);
    QFont::~QFont((QFont *)&local_78);
  }
  else {
    local_30.m_size = 0x10c8fb;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)&local_98,(char **)&local_30);
    QVar5.m_data = (storage_type *)local_98.d;
    QVar5.m_size = (qsizetype)local_58;
    QString::fromUtf8(QVar5);
    local_78.d = (Data *)local_58._0_8_;
    local_78.ptr = (char16_t *)local_58._8_8_;
    local_58._0_8_ = (Data *)0x0;
    local_58._8_8_ = (char16_t *)0x0;
    local_78.size = local_48;
    local_48 = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    local_20 = "Noto Sans";
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_30,&local_20);
    QVar6.m_data = (storage_type *)local_30.m_size;
    QVar6.m_size = (qsizetype)local_58;
    QString::fromUtf8(QVar6);
    local_98.d = (Data *)local_58._0_8_;
    local_98.ptr = (char16_t *)local_58._8_8_;
    local_58._0_8_ = (Data *)0x0;
    local_58._8_8_ = (char16_t *)0x0;
    local_98.size = local_48;
    local_48 = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    QString::arg((QString *)&local_b8,(int)&local_78,(QChar)(char16_t)&local_98);
    QString::toLatin1_helper_inplace((QString *)&local_d8);
    if (local_d8.ptr == (char16_t *)0x0) {
      local_d8.ptr = (char16_t *)&QByteArray::_empty;
    }
    QTest::qSkip((char *)local_d8.ptr,
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                 ,0x6e);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  return;
}

Assistant:

void fontScalerShouldScaleForHeight()
    {
#ifndef Q_OS_MAC // disabled on Mac due to a different DPI value. The code should be portable anyway :)
        SKIP_IF_FONT_NOT_FOUND

        QFont f(s_fontName);
        f.setPixelSize(86);
        FontScaler scaler(f);

        const qreal wantedHeight = 50;
        scaler.setFactorForHeight(wantedHeight);
        const qreal factor = scaler.scalingFactor();
        QVERIFY2(factor > 0.42, qPrintable(QString::number(factor)));
        QVERIFY2(factor < 0.49, qPrintable(QString::number(factor)));

        {
            const qreal scaledHeight = scaler.fontMetrics().height();
            QVERIFY2(scaledHeight <= wantedHeight, qPrintable(QString::number(scaledHeight)));
            QVERIFY2(scaledHeight > wantedHeight - 6, qPrintable(QString::number(scaledHeight)));
        }

#ifndef Q_OS_WIN
        // Testing a really small wanted height
        // Seems that on linux we can't go down to 2.7, the min is 3.0
        // Maybe because ascent=1, descent=1, height=1+1+1=3. Well, sometimes 4.
        // On Windows we can get 2, though.
        scaler.setFactorForHeight(2.9);
        QVERIFY2(scaler.fontMetrics().height() <= 4, qPrintable(QString::number(scaler.fontMetrics().height())));
#endif
#endif
    }